

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

void __thiscall S2Builder::Graph::VertexInMap::Init(VertexInMap *this,Graph *g)

{
  bool bVar1;
  value_type_conflict1 vVar2;
  Graph *this_00;
  VertexId VVar3;
  EdgeId EVar4;
  reference pvVar5;
  Edge *pEVar6;
  int local_38;
  value_type_conflict1 local_34;
  VertexId v;
  EdgeId e;
  Graph *local_18;
  Graph *g_local;
  VertexInMap *this_local;
  
  local_18 = g;
  g_local = (Graph *)this;
  GetInEdgeIds((vector<int,_std::allocator<int>_> *)&v,g);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->in_edge_ids_,(vector<int,_std::allocator<int>_> *)&v);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&v);
  VVar3 = Graph::num_vertices(local_18);
  std::vector<int,_std::allocator<int>_>::reserve(&this->in_edge_begins_,(long)(VVar3 + 1));
  local_34 = 0;
  for (local_38 = 0; VVar3 = Graph::num_vertices(local_18), local_38 <= VVar3;
      local_38 = local_38 + 1) {
    while( true ) {
      vVar2 = local_34;
      EVar4 = Graph::num_edges(local_18);
      this_00 = local_18;
      bVar1 = false;
      if (vVar2 < EVar4) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->in_edge_ids_,(long)local_34);
        pEVar6 = Graph::edge(this_00,*pvVar5);
        bVar1 = pEVar6->second < local_38;
      }
      if (!bVar1) break;
      local_34 = local_34 + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->in_edge_begins_,&local_34);
  }
  return;
}

Assistant:

void Graph::VertexInMap::Init(const Graph& g) {
  in_edge_ids_ = g.GetInEdgeIds();
  in_edge_begins_.reserve(g.num_vertices() + 1);
  EdgeId e = 0;
  for (VertexId v = 0; v <= g.num_vertices(); ++v) {
    while (e < g.num_edges() && g.edge(in_edge_ids_[e]).second < v) ++e;
    in_edge_begins_.push_back(e);
  }
}